

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r,secp256k1_ge_storage *pre,int n,int w)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  ulong uVar6;
  undefined4 in_register_0000000c;
  secp256k1_ge *a;
  ulong uVar7;
  secp256k1_ge *a_00;
  secp256k1_gej *a_01;
  ulong uVar8;
  secp256k1_gej *a_02;
  ulong uVar9;
  secp256k1_ge *a_03;
  ulong uVar10;
  secp256k1_gej *a_04;
  secp256k1_fe *psVar11;
  secp256k1_gej *a_05;
  secp256k1_fe sStack_2f8;
  secp256k1_fe sStack_2c8;
  secp256k1_gej *psStack_298;
  secp256k1_gej *psStack_290;
  secp256k1_fe *psStack_288;
  secp256k1_gej *psStack_280;
  secp256k1_gej *psStack_278;
  secp256k1_fe *psStack_268;
  undefined1 auStack_260 [56];
  uint64_t uStack_228;
  uint64_t uStack_220;
  uint64_t uStack_218;
  ulong uStack_210;
  ulong uStack_208;
  undefined1 auStack_200 [56];
  uint64_t uStack_1c8;
  uint64_t uStack_1c0;
  uint64_t uStack_1b8;
  ulong uStack_1b0;
  ulong uStack_1a8;
  undefined1 auStack_1a0 [56];
  uint64_t uStack_168;
  uint64_t uStack_160;
  uint64_t uStack_158;
  uint64_t uStack_150;
  int iStack_148;
  secp256k1_fe sStack_140;
  secp256k1_fe sStack_110;
  secp256k1_fe sStack_e0;
  secp256k1_fe sStack_b0;
  uint64_t uStack_80;
  uint64_t uStack_78;
  uint64_t uStack_70;
  uint64_t uStack_68;
  secp256k1_fe *psStack_60;
  int iStack_58;
  int iStack_54;
  
  psVar11 = (secp256k1_fe *)CONCAT44(in_register_0000000c,w);
  if ((n & 1U) == 0) {
    secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_00119ab1:
    secp256k1_ecmult_table_get_ge_storage_cold_2();
  }
  else {
    if (n < -7) goto LAB_00119ab1;
    if (n < 8) {
      if (n < 1) {
        secp256k1_ge_from_storage(r,pre + ((uint)~n >> 1));
        psVar11 = &r->y;
        secp256k1_fe_verify(psVar11);
        secp256k1_fe_verify_magnitude(psVar11,1);
        uVar2 = (r->y).n[1];
        uVar3 = (r->y).n[2];
        uVar4 = (r->y).n[3];
        (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
        (r->y).n[1] = 0x3ffffffffffffc - uVar2;
        (r->y).n[2] = 0x3ffffffffffffc - uVar3;
        (r->y).n[3] = 0x3ffffffffffffc - uVar4;
        (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
        (r->y).magnitude = 2;
        (r->y).normalized = 0;
        secp256k1_fe_verify(psVar11);
        return;
      }
      secp256k1_ge_from_storage(r,pre + (n - 1U >> 1));
      return;
    }
  }
  secp256k1_ecmult_table_get_ge_storage_cold_1();
  psStack_278 = (secp256k1_gej *)0x119ae0;
  secp256k1_gej_verify((secp256k1_gej *)pre);
  psStack_278 = (secp256k1_gej *)0x119ae8;
  secp256k1_ge_verify(a);
  psStack_278 = (secp256k1_gej *)0x119af0;
  secp256k1_fe_verify(psVar11);
  if (((secp256k1_gej *)pre)->infinity != 0) {
    ((secp256k1_gej *)r)->infinity = a->infinity;
    psStack_278 = (secp256k1_gej *)0x119b1c;
    secp256k1_fe_sqr(&sStack_140,psVar11);
    psStack_278 = (secp256k1_gej *)0x119b32;
    secp256k1_fe_mul(&sStack_b0,&sStack_140,psVar11);
    psStack_278 = (secp256k1_gej *)0x119b40;
    secp256k1_fe_mul(&r->x,&a->x,&sStack_140);
    psStack_278 = (secp256k1_gej *)0x119b53;
    secp256k1_fe_mul(&((secp256k1_gej *)r)->y,&a->y,&sStack_b0);
    pre = (secp256k1_ge_storage *)&((secp256k1_gej *)r)->z;
    (((secp256k1_gej *)r)->z).n[0] = 1;
    (((secp256k1_gej *)r)->z).n[1] = 0;
    (((secp256k1_gej *)r)->z).n[2] = 0;
    (((secp256k1_gej *)r)->z).n[3] = 0;
    (((secp256k1_gej *)r)->z).n[4] = 0;
    (((secp256k1_gej *)r)->z).magnitude = 1;
    (((secp256k1_gej *)r)->z).normalized = 1;
LAB_00119b7e:
    psStack_278 = (secp256k1_gej *)0x119b83;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    psStack_278 = (secp256k1_gej *)0x119b8b;
    secp256k1_gej_verify((secp256k1_gej *)r);
    return;
  }
  if (a->infinity != 0) {
    memcpy(r,pre,0x98);
    return;
  }
  psStack_268 = &((secp256k1_gej *)pre)->z;
  psStack_278 = (secp256k1_gej *)0x119be2;
  secp256k1_fe_mul(&sStack_140,psStack_268,psVar11);
  psVar11 = &sStack_b0;
  psStack_278 = (secp256k1_gej *)0x119bf5;
  secp256k1_fe_sqr(psVar11,&sStack_140);
  sStack_e0.n[0] = (((secp256k1_gej *)pre)->x).n[0];
  sStack_e0.n[1] = (((secp256k1_gej *)pre)->x).n[1];
  sStack_e0.n[2] = (((secp256k1_gej *)pre)->x).n[2];
  sStack_e0.n[3] = (((secp256k1_gej *)pre)->x).n[3];
  sStack_e0.n[4] = (((secp256k1_gej *)pre)->x).n[4];
  sStack_e0.magnitude = (((secp256k1_gej *)pre)->x).magnitude;
  sStack_e0.normalized = (((secp256k1_gej *)pre)->x).normalized;
  psStack_278 = (secp256k1_gej *)0x119c2a;
  secp256k1_fe_mul((secp256k1_fe *)(auStack_1a0 + 0x30),&a->x,psVar11);
  auStack_200._0_8_ = (((secp256k1_gej *)pre)->y).n[0];
  auStack_200._8_8_ = (((secp256k1_gej *)pre)->y).n[1];
  auStack_200._16_8_ = (((secp256k1_gej *)pre)->y).n[2];
  auStack_200._24_8_ = (((secp256k1_gej *)pre)->y).n[3];
  auStack_200._32_8_ = (((secp256k1_gej *)pre)->y).n[4];
  auStack_200._40_4_ = (((secp256k1_gej *)pre)->y).magnitude;
  auStack_200._44_4_ = (((secp256k1_gej *)pre)->y).normalized;
  psStack_278 = (secp256k1_gej *)0x119c68;
  secp256k1_fe_mul(&sStack_110,&a->y,psVar11);
  psStack_278 = (secp256k1_gej *)0x119c7b;
  secp256k1_fe_mul(&sStack_110,&sStack_110,&sStack_140);
  psStack_278 = (secp256k1_gej *)0x119c83;
  secp256k1_fe_verify(&sStack_e0);
  a_01 = (secp256k1_gej *)0x4;
  psStack_278 = (secp256k1_gej *)0x119c90;
  secp256k1_fe_verify_magnitude(&sStack_e0,4);
  auStack_200._48_8_ = 0x9ffff5ffffd9d6 - sStack_e0.n[0];
  uStack_1c8 = 0x9ffffffffffff6 - sStack_e0.n[1];
  a_05 = (secp256k1_gej *)(auStack_200 + 0x30);
  uStack_1c0 = 0x9ffffffffffff6 - sStack_e0.n[2];
  uStack_1b8 = 0x9ffffffffffff6 - sStack_e0.n[3];
  uStack_1b0 = 0x9fffffffffff6 - sStack_e0.n[4];
  uStack_1a8 = 5;
  psStack_278 = (secp256k1_gej *)0x119cdf;
  secp256k1_fe_verify((secp256k1_fe *)a_05);
  psStack_278 = (secp256k1_gej *)0x119ce7;
  secp256k1_fe_verify((secp256k1_fe *)a_05);
  a_04 = (secp256k1_gej *)(auStack_1a0 + 0x30);
  psStack_278 = (secp256k1_gej *)0x119cf7;
  a_02 = a_04;
  secp256k1_fe_verify((secp256k1_fe *)a_04);
  if (iStack_148 + (int)uStack_1a8 < 0x21) {
    auStack_200._48_8_ = auStack_200._48_8_ + auStack_1a0._48_8_;
    uStack_1c8 = uStack_1c8 + uStack_168;
    uStack_1c0 = uStack_1c0 + uStack_160;
    uStack_1b8 = uStack_1b8 + uStack_158;
    uStack_1b0 = uStack_1b0 + uStack_150;
    psVar11 = (secp256k1_fe *)0x3fffffffffffc;
    uStack_1a8 = (ulong)(uint)(iStack_148 + (int)uStack_1a8);
    psStack_278 = (secp256k1_gej *)0x119d5a;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_200 + 0x30));
    psStack_278 = (secp256k1_gej *)0x119d6a;
    secp256k1_fe_verify(&sStack_110);
    a_01 = (secp256k1_gej *)0x1;
    psStack_278 = (secp256k1_gej *)0x119d77;
    secp256k1_fe_verify_magnitude(&sStack_110,1);
    auStack_260._48_8_ = 0x3ffffbfffff0bc - sStack_110.n[0];
    uStack_228 = 0x3ffffffffffffc - sStack_110.n[1];
    a_04 = (secp256k1_gej *)(auStack_260 + 0x30);
    uStack_220 = 0x3ffffffffffffc - sStack_110.n[2];
    uStack_218 = 0x3ffffffffffffc - sStack_110.n[3];
    uStack_210 = 0x3fffffffffffc - sStack_110.n[4];
    uStack_208 = 2;
    psStack_278 = (secp256k1_gej *)0x119dc1;
    secp256k1_fe_verify((secp256k1_fe *)a_04);
    psStack_278 = (secp256k1_gej *)0x119dc9;
    secp256k1_fe_verify((secp256k1_fe *)a_04);
    a_05 = (secp256k1_gej *)auStack_200;
    psStack_278 = (secp256k1_gej *)0x119dd6;
    a_02 = a_05;
    secp256k1_fe_verify((secp256k1_fe *)a_05);
    if (0x20 < auStack_200._40_4_ + (int)uStack_208) goto LAB_0011a2a2;
    auStack_260._48_8_ = auStack_260._48_8_ + auStack_200._0_8_;
    uStack_228 = uStack_228 + auStack_200._8_8_;
    uStack_220 = uStack_220 + auStack_200._16_8_;
    uStack_218 = uStack_218 + auStack_200._24_8_;
    uStack_210 = uStack_210 + auStack_200._32_8_;
    uStack_208 = (ulong)(uint)(auStack_200._40_4_ + (int)uStack_208);
    psStack_278 = (secp256k1_gej *)0x119e3d;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_260 + 0x30));
    psStack_278 = (secp256k1_gej *)0x119e4d;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_200 + 0x30));
    uVar6 = (uStack_1b0 >> 0x30) * 0x1000003d1 + auStack_200._48_8_;
    if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
      uVar7 = (uVar6 >> 0x34) + uStack_1c8;
      uVar8 = (uVar7 >> 0x34) + uStack_1c0;
      uVar9 = (uVar8 >> 0x34) + uStack_1b8;
      uVar10 = (uVar9 >> 0x34) + (uStack_1b0 & 0xffffffffffff);
      if ((((uVar7 | uVar6 | uVar8 | uVar9) & 0xfffffffffffff) == 0 && uVar10 == 0) ||
         (((uVar6 | 0x1000003d0) & uVar7 & uVar8 & uVar9 & (uVar10 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        psStack_278 = (secp256k1_gej *)0x11a1df;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_260 + 0x30));
        uVar6 = (uStack_210 >> 0x30) * 0x1000003d1 + auStack_260._48_8_;
        if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
          uVar7 = (uVar6 >> 0x34) + uStack_228;
          uVar8 = (uVar7 >> 0x34) + uStack_220;
          uVar9 = (uVar8 >> 0x34) + uStack_218;
          uVar10 = (uVar9 >> 0x34) + (uStack_210 & 0xffffffffffff);
          if ((((uVar7 | uVar6 | uVar8 | uVar9) & 0xfffffffffffff) == 0 && uVar10 == 0) ||
             (((uVar6 | 0x1000003d0) & uVar7 & uVar8 & uVar9 & (uVar10 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            psStack_278 = (secp256k1_gej *)0x11a298;
            secp256k1_gej_double_var((secp256k1_gej *)r,(secp256k1_gej *)pre,(secp256k1_fe *)0x0);
            return;
          }
        }
        psStack_278 = (secp256k1_gej *)0x11a286;
        secp256k1_gej_set_infinity((secp256k1_gej *)r);
        return;
      }
    }
    ((secp256k1_gej *)r)->infinity = 0;
    a_05 = (secp256k1_gej *)(auStack_200 + 0x30);
    psStack_278 = (secp256k1_gej *)0x119f2a;
    secp256k1_fe_mul(&((secp256k1_gej *)r)->z,psStack_268,(secp256k1_fe *)a_05);
    pre = (secp256k1_ge_storage *)&stack0xffffffffffffff80;
    psStack_278 = (secp256k1_gej *)0x119f3d;
    secp256k1_fe_sqr((secp256k1_fe *)pre,(secp256k1_fe *)a_05);
    psStack_278 = (secp256k1_gej *)0x119f45;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    psStack_278 = (secp256k1_gej *)0x119f52;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)pre,1);
    uStack_80 = 0x3ffffbfffff0bc - uStack_80;
    uStack_78 = 0x3ffffffffffffc - uStack_78;
    uStack_70 = 0x3ffffffffffffc - uStack_70;
    uStack_68 = 0x3ffffffffffffc - uStack_68;
    psVar11 = (secp256k1_fe *)(0x3fffffffffffc - (long)psStack_60);
    iStack_58 = 2;
    iStack_54 = 0;
    psStack_278 = (secp256k1_gej *)0x119f90;
    psStack_60 = psVar11;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    a_04 = (secp256k1_gej *)auStack_260;
    psStack_278 = (secp256k1_gej *)0x119fa3;
    secp256k1_fe_mul((secp256k1_fe *)a_04,(secp256k1_fe *)pre,(secp256k1_fe *)a_05);
    psStack_278 = (secp256k1_gej *)0x119fbb;
    secp256k1_fe_mul((secp256k1_fe *)auStack_1a0,&sStack_e0,(secp256k1_fe *)pre);
    a_01 = (secp256k1_gej *)(auStack_260 + 0x30);
    psStack_278 = (secp256k1_gej *)0x119fc8;
    secp256k1_fe_sqr(&r->x,(secp256k1_fe *)a_01);
    psStack_278 = (secp256k1_gej *)0x119fd0;
    secp256k1_fe_verify(&r->x);
    psStack_278 = (secp256k1_gej *)0x119fd8;
    a_02 = a_04;
    secp256k1_fe_verify((secp256k1_fe *)a_04);
    iVar5 = auStack_260._40_4_ + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar5) goto LAB_0011a2a7;
    uVar2 = (((secp256k1_gej *)r)->x).n[1];
    uVar3 = (((secp256k1_gej *)r)->x).n[2];
    uVar4 = (((secp256k1_gej *)r)->x).n[3];
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_260._0_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar2 + auStack_260._8_8_;
    (((secp256k1_gej *)r)->x).n[2] = uVar3 + auStack_260._16_8_;
    (((secp256k1_gej *)r)->x).n[3] = uVar4 + auStack_260._24_8_;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + auStack_260._32_8_;
    (((secp256k1_gej *)r)->x).magnitude = iVar5;
    (((secp256k1_gej *)r)->x).normalized = 0;
    psStack_278 = (secp256k1_gej *)0x11a022;
    secp256k1_fe_verify(&r->x);
    psStack_278 = (secp256k1_gej *)0x11a02a;
    secp256k1_fe_verify(&r->x);
    pre = (secp256k1_ge_storage *)auStack_1a0;
    psStack_278 = (secp256k1_gej *)0x11a03a;
    a_02 = (secp256k1_gej *)pre;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    iVar5 = auStack_1a0._40_4_ + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar5) goto LAB_0011a2ac;
    uVar2 = (((secp256k1_gej *)r)->x).n[1];
    uVar3 = (((secp256k1_gej *)r)->x).n[2];
    uVar4 = (((secp256k1_gej *)r)->x).n[3];
    pre = (secp256k1_ge_storage *)auStack_1a0;
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_1a0._0_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar2 + auStack_1a0._8_8_;
    (((secp256k1_gej *)r)->x).n[2] = uVar3 + auStack_1a0._16_8_;
    (((secp256k1_gej *)r)->x).n[3] = uVar4 + auStack_1a0._24_8_;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + auStack_1a0._32_8_;
    (((secp256k1_gej *)r)->x).magnitude = iVar5;
    (((secp256k1_gej *)r)->x).normalized = 0;
    psStack_278 = (secp256k1_gej *)0x11a089;
    secp256k1_fe_verify(&r->x);
    psStack_278 = (secp256k1_gej *)0x11a091;
    secp256k1_fe_verify(&r->x);
    psStack_278 = (secp256k1_gej *)0x11a099;
    a_02 = (secp256k1_gej *)pre;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    iVar5 = auStack_1a0._40_4_ + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar5) goto LAB_0011a2b1;
    uVar2 = (((secp256k1_gej *)r)->x).n[1];
    uVar3 = (((secp256k1_gej *)r)->x).n[2];
    uVar4 = (((secp256k1_gej *)r)->x).n[3];
    pre = (secp256k1_ge_storage *)auStack_1a0;
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_1a0._0_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar2 + auStack_1a0._8_8_;
    (((secp256k1_gej *)r)->x).n[2] = uVar3 + auStack_1a0._16_8_;
    (((secp256k1_gej *)r)->x).n[3] = uVar4 + auStack_1a0._24_8_;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + auStack_1a0._32_8_;
    (((secp256k1_gej *)r)->x).magnitude = iVar5;
    (((secp256k1_gej *)r)->x).normalized = 0;
    psStack_278 = (secp256k1_gej *)0x11a0e8;
    secp256k1_fe_verify(&r->x);
    psStack_278 = (secp256k1_gej *)0x11a0f0;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    psStack_278 = (secp256k1_gej *)0x11a0f8;
    a_02 = (secp256k1_gej *)r;
    secp256k1_fe_verify(&r->x);
    iVar5 = (((secp256k1_gej *)r)->x).magnitude + auStack_1a0._40_4_;
    if (iVar5 < 0x21) {
      auStack_1a0._0_8_ = (((secp256k1_gej *)r)->x).n[0] + auStack_1a0._0_8_;
      auStack_1a0._8_8_ = (((secp256k1_gej *)r)->x).n[1] + auStack_1a0._8_8_;
      auStack_1a0._16_8_ = (((secp256k1_gej *)r)->x).n[2] + auStack_1a0._16_8_;
      auStack_1a0._24_8_ = (((secp256k1_gej *)r)->x).n[3] + auStack_1a0._24_8_;
      auStack_1a0._32_8_ = auStack_1a0._32_8_ + (((secp256k1_gej *)r)->x).n[4];
      auStack_1a0._44_4_ = 0;
      psStack_278 = (secp256k1_gej *)0x11a14b;
      auStack_1a0._40_4_ = iVar5;
      secp256k1_fe_verify((secp256k1_fe *)auStack_1a0);
      pre = (secp256k1_ge_storage *)&((secp256k1_gej *)r)->y;
      psStack_278 = (secp256k1_gej *)0x11a15f;
      secp256k1_fe_mul((secp256k1_fe *)pre,(secp256k1_fe *)auStack_1a0,
                       (secp256k1_fe *)(auStack_260 + 0x30));
      a_05 = (secp256k1_gej *)auStack_260;
      psStack_278 = (secp256k1_gej *)0x11a174;
      a_01 = a_05;
      secp256k1_fe_mul((secp256k1_fe *)a_05,(secp256k1_fe *)a_05,(secp256k1_fe *)auStack_200);
      psStack_278 = (secp256k1_gej *)0x11a17c;
      secp256k1_fe_verify((secp256k1_fe *)pre);
      psStack_278 = (secp256k1_gej *)0x11a184;
      a_02 = a_05;
      secp256k1_fe_verify((secp256k1_fe *)a_05);
      iVar5 = auStack_260._40_4_ + (((secp256k1_gej *)r)->y).magnitude;
      if (iVar5 < 0x21) {
        uVar2 = (((secp256k1_gej *)r)->y).n[1];
        uVar3 = (((secp256k1_gej *)r)->y).n[2];
        uVar4 = (((secp256k1_gej *)r)->y).n[3];
        (((secp256k1_gej *)r)->y).n[0] = (((secp256k1_gej *)r)->y).n[0] + auStack_260._0_8_;
        (((secp256k1_gej *)r)->y).n[1] = uVar2 + auStack_260._8_8_;
        (((secp256k1_gej *)r)->y).n[2] = uVar3 + auStack_260._16_8_;
        (((secp256k1_gej *)r)->y).n[3] = uVar4 + auStack_260._24_8_;
        puVar1 = (((secp256k1_gej *)r)->y).n + 4;
        *puVar1 = *puVar1 + auStack_260._32_8_;
        (((secp256k1_gej *)r)->y).magnitude = iVar5;
        (((secp256k1_gej *)r)->y).normalized = 0;
        goto LAB_00119b7e;
      }
      goto LAB_0011a2bb;
    }
  }
  else {
    psStack_278 = (secp256k1_gej *)0x11a2a2;
    secp256k1_gej_add_zinv_var_cold_7();
LAB_0011a2a2:
    psStack_278 = (secp256k1_gej *)0x11a2a7;
    secp256k1_gej_add_zinv_var_cold_6();
LAB_0011a2a7:
    psStack_278 = (secp256k1_gej *)0x11a2ac;
    secp256k1_gej_add_zinv_var_cold_5();
LAB_0011a2ac:
    psStack_278 = (secp256k1_gej *)0x11a2b1;
    secp256k1_gej_add_zinv_var_cold_4();
LAB_0011a2b1:
    psStack_278 = (secp256k1_gej *)0x11a2b6;
    secp256k1_gej_add_zinv_var_cold_3();
  }
  psStack_278 = (secp256k1_gej *)0x11a2bb;
  secp256k1_gej_add_zinv_var_cold_2();
LAB_0011a2bb:
  psStack_278 = (secp256k1_gej *)secp256k1_ge_set_gej_zinv;
  secp256k1_gej_add_zinv_var_cold_1();
  psStack_298 = (secp256k1_gej *)r;
  psStack_290 = a_04;
  psStack_288 = psVar11;
  psStack_280 = (secp256k1_gej *)pre;
  psStack_278 = a_05;
  secp256k1_gej_verify(a_01);
  a_03 = a_00;
  secp256k1_fe_verify(&a_00->x);
  if (a_01->infinity != 0) {
    secp256k1_ge_set_gej_zinv_cold_1();
    a_03->infinity = 1;
    (a_03->x).magnitude = 0;
    (a_03->x).normalized = 1;
    (a_03->x).n[0] = 0;
    (a_03->x).n[1] = 0;
    (a_03->x).n[2] = 0;
    (a_03->x).n[3] = 0;
    (a_03->x).n[4] = 0;
    secp256k1_fe_verify(&a_03->x);
    (a_03->y).magnitude = 0;
    (a_03->y).normalized = 1;
    (a_03->y).n[0] = 0;
    (a_03->y).n[1] = 0;
    (a_03->y).n[2] = 0;
    (a_03->y).n[3] = 0;
    (a_03->y).n[4] = 0;
    secp256k1_fe_verify(&a_03->y);
    secp256k1_ge_verify(a_03);
    return;
  }
  secp256k1_fe_sqr(&sStack_2c8,&a_00->x);
  secp256k1_fe_mul(&sStack_2f8,&sStack_2c8,&a_00->x);
  secp256k1_fe_mul(&a_02->x,&a_01->x,&sStack_2c8);
  secp256k1_fe_mul(&a_02->y,&a_01->y,&sStack_2f8);
  *(int *)(a_02->z).n = a_01->infinity;
  secp256k1_ge_verify((secp256k1_ge *)a_02);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r, const secp256k1_ge_storage *pre, int n, int w) {
    secp256k1_ecmult_table_verify(n,w);
    if (n > 0) {
        secp256k1_ge_from_storage(r, &pre[(n-1)/2]);
    } else {
        secp256k1_ge_from_storage(r, &pre[(-n-1)/2]);
        secp256k1_fe_negate(&(r->y), &(r->y), 1);
    }
}